

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O2

void kv_set_var_test(void)

{
  uint64_t uVar1;
  int iVar2;
  bnode *pbVar3;
  char *__format;
  long local_d8;
  void *key;
  void *vars [2];
  timeval __test_begin;
  btree_kv_ops local_a8;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  key = malloc(0xd);
  *(undefined2 *)key = 0xb00;
  *(undefined8 *)((long)key + 2) = 0x6972747374736574;
  *(undefined4 *)((long)key + 9) = 0x676e69;
  local_d8 = 10;
  btree_str_kv_get_kb64_vb64(&local_a8);
  pbVar3 = dummy_node('\r','\b',1);
  (*local_a8.set_kv)(pbVar3,0,&key,&local_d8);
  uVar1 = (pbVar3->field_4).dummy;
  iVar2 = strcmp((char *)(uVar1 + 2),"teststring");
  if (iVar2 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0xf1);
    kv_set_var_test()::__test_pass = 1;
    __assert_fail("cmp == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                  ,0xf1,"void kv_set_var_test()");
  }
  if (*(long *)(uVar1 + 0xd) == local_d8) {
    vars[1] = key;
    vars[0] = pbVar3;
    freevars(vars,2);
    memleak_end();
    __format = "%s PASSED\n";
    if (kv_set_var_test()::__test_pass != '\0') {
      __format = "%s FAILED\n";
    }
    fprintf(_stderr,__format,"kv set var test");
    return;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
          ,0xf3);
  kv_set_var_test()::__test_pass = 1;
  __assert_fail("cmp == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                ,0xf3,"void kv_set_var_test()");
}

Assistant:

void kv_set_var_test()
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    btree_kv_ops *kv_ops;
    void *key, *value;
    uint8_t ksize, vsize;
    int level;
    uint64_t v;
    int cmp;
    idx_t idx;
    char str[] = "teststring";
    key_len_t str_len = sizeof(str);

    vsize = sizeof(v);
    v = 10;

    construct_key_ptr(str, str_len, &key);
    value = alca(uint8_t, vsize);
    memset(value, 0, vsize);
    memcpy(value, &v, vsize);

    // init ops
    kv_ops = alca(btree_kv_ops, 1);
    btree_str_kv_get_kb64_vb64(kv_ops);

    // set key/value in node
    idx = 0;
    level = 1;
    ksize = str_len + sizeof(key_len_t);
    node = dummy_node(ksize, vsize, level);
    kv_ops->set_kv(node, idx, &key, value);

    // verify node->data
    cmp = strcmp((char *)((uint8_t *)node->data + sizeof(key_len_t)), str);
    TEST_CHK(cmp == 0);
    cmp = memcmp((uint8_t *)node->data + ksize, value, vsize);
    TEST_CHK(cmp == 0);

    void *vars[] = {node, key};
    freevars(vars, sizeof(vars)/sizeof(void *));

    memleak_end();
    TEST_RESULT("kv set var test");
}